

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O0

void __thiscall
cfdcapi_key_MnemonicTest_Test::cfdcapi_key_MnemonicTest_Test(cfdcapi_key_MnemonicTest_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__cfdcapi_key_MnemonicTest_Test_009f5018;
  return;
}

Assistant:

TEST(cfdcapi_key, MnemonicTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* mnemonic_word = nullptr;
  char* mnemonic = nullptr;
  void* mnemonic_handle = nullptr;
  uint32_t max_index = 0;
  ret = CfdInitializeMnemonicWordList(handle, "en", &mnemonic_handle, &max_index);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(2048, max_index);
  if (ret == kCfdSuccess) {
    ret = CfdGetMnemonicWord(handle, mnemonic_handle, 3, &mnemonic_word);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("about", mnemonic_word);
      CfdFreeStringBuffer(mnemonic_word);
      mnemonic_word = nullptr;
    }

    ret = CfdFreeMnemonicWordList(handle, mnemonic_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  char* mnemonic_words = nullptr;
  ret = CfdGetMnemonicWords(handle, "en", &mnemonic_words);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    auto words = StringUtil::Split(mnemonic_words, " ");
    EXPECT_EQ("about", words[3]);
    EXPECT_EQ(2048, words.size());
  }

  char* seed = nullptr;
  char* entropy = nullptr;
  const char* test_mnemonic = "horn tenant knee talent sponsor spell gate clip pulse soap slush warm silver nephew swap uncle crack brave";
  const char* exp_entropy = "6d9be1ee6ebd27a258115aad99b7317b9c8d28b6d76431c3";
  ret = CfdConvertMnemonicToSeed(handle, test_mnemonic, "TREZOR", true, "en", false, &seed, &entropy);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("fd579828af3da1d32544ce4db5c73d53fc8acc4ddb1e3b251a31179cdb71e853c56d2fcb11aed39898ce6c34b10b5382772db8796e52837b54468aeb312cfc3d", seed);
    EXPECT_STREQ(exp_entropy, entropy);
    CfdFreeStringBuffer(seed);
    CfdFreeStringBuffer(entropy);
  }

  ret = CfdConvertMnemonicToSeed(handle, test_mnemonic, "abcde", true, "en", false, &seed, &entropy);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("fd3bb1e11eb0e3e59e8ba4d6eefca06446c504123f73096142766ad4803e19e777091973655b5cd3e951d72fda51be48f9ae231bab59d3a37f547ffc73dc00b5", seed);
    EXPECT_STREQ(exp_entropy, entropy);
    CfdFreeStringBuffer(seed);
    CfdFreeStringBuffer(entropy);
  }

  ret = CfdConvertEntropyToMnemonic(handle, exp_entropy, "en", &mnemonic);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(test_mnemonic, mnemonic);
    CfdFreeStringBuffer(mnemonic);
    mnemonic = nullptr;
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}